

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O2

void av1_temporal_filter(AV1_COMP *cpi,int filter_frame_lookahead_idx,int gf_frame_index,
                        FRAME_DIFF *frame_diff,YV12_BUFFER_CONFIG *output_frame)

{
  TemporalFilterData *pTVar1;
  double *noise_level;
  scale_factors *sf;
  uint8_t **ppuVar2;
  FRAME_UPDATE_TYPE FVar3;
  FRAME_TYPE FVar4;
  AV1_PRIMARY *pAVar5;
  SequenceHeader *pSVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  MB_MODE_INFO **ppMVar8;
  int64_t iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  lookahead_entry *frame;
  ulong uVar15;
  byte *pbVar16;
  lookahead_entry *plVar17;
  MB_MODE_INFO *pMVar18;
  uint32_t *puVar19;
  uint16_t *puVar20;
  void *pvVar21;
  uint8_t *puVar22;
  buf_2d *pbVar23;
  uint uVar24;
  FIRSTPASS_STATS *pFVar25;
  int num_planes;
  int mb_row;
  uint uVar26;
  FIRSTPASS_STATS *pFVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  size_t size;
  uint b_frames;
  ulong uVar31;
  uint uVar32;
  ThreadData_conflict *td;
  long lVar33;
  bool bVar34;
  double dVar35;
  int iVar36;
  double dVar37;
  double dVar38;
  uint8_t *input_buffer [3];
  
  (cpi->tf_ctx).num_frames = 0;
  (cpi->tf_ctx).filter_frame_idx = -1;
  pTVar1 = &(cpi->td).tf_data;
  (cpi->tf_ctx).output_frame = output_frame;
  (cpi->tf_ctx).compute_frame_diff = (uint)(frame_diff != (FRAME_DIFF *)0x0);
  pAVar5 = cpi->ppi;
  FVar3 = (pAVar5->gf_group).update_type[gf_frame_index];
  FVar4 = (pAVar5->gf_group).frame_type[gf_frame_index];
  iVar10 = av1_gop_check_forward_keyframe(&pAVar5->gf_group,gf_frame_index);
  iVar14 = (cpi->oxcf).algo_cfg.arnr_max_frames;
  iVar36 = 1;
  if (1 < iVar14) {
    iVar36 = iVar14;
  }
  uVar11 = av1_lookahead_depth(cpi->ppi->lookahead,cpi->compressor_stage);
  uVar24 = (cpi->rc).frames_since_key + filter_frame_lookahead_idx;
  uVar30 = 0;
  if ((int)uVar24 < 1) {
    uVar24 = 0;
  }
  uVar12 = uVar11 + ~filter_frame_lookahead_idx;
  b_frames = ~filter_frame_lookahead_idx + (cpi->rc).frames_to_key;
  if ((int)b_frames < 1) {
    b_frames = 0;
  }
  if (filter_frame_lookahead_idx <= (int)uVar24) {
    uVar24 = filter_frame_lookahead_idx;
  }
  if ((int)uVar12 < (int)b_frames) {
    b_frames = uVar12;
  }
  frame = av1_lookahead_peek(cpi->ppi->lookahead,filter_frame_lookahead_idx,cpi->compressor_stage);
  pSVar6 = (cpi->common).seq_params;
  bVar34 = pSVar6->monochrome == '\0';
  num_planes = (uint)bVar34 * 2 + 1;
  noise_level = (cpi->tf_ctx).noise_levels;
  av1_estimate_noise_level(&frame->img,noise_level,0,(uint)bVar34 * 2,pSVar6->bit_depth,0x32);
  iVar13 = get_q(cpi);
  uVar31 = (ulong)((cpi->rc).frames_since_key == 0);
  pFVar27 = (cpi->twopass_frame).stats_in;
  uVar15 = 0;
  if (0 < (int)b_frames) {
    uVar15 = (ulong)b_frames;
  }
  pFVar25 = pFVar27 + (long)filter_frame_lookahead_idx + 1;
  dVar35 = 1.0;
  for (; uVar15 != uVar30; uVar30 = uVar30 + 1) {
    if (((cpi->ppi->twopass).stats_buf_ctx)->stats_in_end <= pFVar25 + -uVar31) {
      b_frames = (uint)uVar30;
      break;
    }
    dVar38 = pFVar25[-uVar31].cor_coeff;
    if (dVar38 <= 0.001) {
      dVar38 = 0.001;
    }
    dVar35 = dVar35 * dVar38;
    pFVar25 = pFVar25 + 1;
  }
  if (0 < (int)b_frames) {
    dVar35 = pow(dVar35,1.0 / (double)(int)b_frames);
  }
  uVar30 = 0;
  uVar15 = 0;
  if (0 < (int)uVar24) {
    uVar15 = (ulong)uVar24;
  }
  pFVar27 = pFVar27 + filter_frame_lookahead_idx;
  dVar38 = 1.0;
  do {
    if (uVar15 == uVar30) {
LAB_0020e869:
      if (0 < (int)uVar24) {
        dVar38 = pow(dVar38,1.0 / (double)(int)uVar24);
      }
      uVar12 = 0;
      if ((1 < iVar14) &&
         ((((iVar14 = (cpi->sf).hl_sf.adjust_num_frames_for_arf_filtering, FVar3 != '\0' ||
            (10 < iVar13)) && (uVar12 = 6, FVar3 != '\0' && 0 < iVar14)) &&
          (0 < (cpi->rc).frames_since_key)))) {
        lVar29 = (ulong)(iVar14 - 1) * 3;
        pbVar16 = &DAT_00464380 + lVar29;
        dVar37 = *noise_level;
        if (0.5 <= dVar37) {
          if (1.0 <= dVar37) {
            pbVar16 = &DAT_00464382 + lVar29;
          }
          else {
            pbVar16 = &DAT_00464381 + lVar29;
          }
        }
        uVar12 = (uint)*pbVar16;
      }
      uVar26 = uVar12 + iVar36;
      if ((int)uVar11 <= (int)(uVar12 + iVar36)) {
        uVar26 = uVar11;
      }
      if (FVar4 == '\0') {
        uVar11 = (int)uVar26 / 2;
        if (iVar10 == 0) {
          uVar11 = 0;
        }
        if ((int)uVar24 <= (int)uVar11) {
          uVar11 = uVar24;
        }
        uVar12 = uVar26 - 1;
        if ((int)b_frames <= (int)(uVar26 - 1)) {
          uVar12 = b_frames;
        }
      }
      else {
        iVar14 = av1_calc_arf_boost(&cpi->ppi->twopass,&cpi->twopass_frame,&cpi->ppi->p_rc,
                                    &cpi->frame_info,filter_frame_lookahead_idx,uVar24,b_frames,
                                    (int *)0x0,(int *)0x0,0);
        uVar11 = iVar14 / 0x96;
        if ((int)uVar26 < iVar14 / 0x96) {
          uVar11 = uVar26;
        }
        uVar11 = uVar11 | 1;
        uVar26 = 3;
        if ((int)uVar11 < 3) {
          uVar26 = uVar11;
        }
        if (FVar3 != '\x06') {
          uVar26 = uVar11;
        }
        uVar28 = uVar24;
        if ((int)b_frames < (int)uVar24) {
          uVar28 = b_frames;
        }
        uVar12 = (int)uVar26 / 2;
        uVar11 = uVar12;
        if ((int)uVar28 < (int)uVar12) {
          uVar28 = b_frames;
          uVar32 = uVar24;
          if ((int)b_frames < (int)uVar12) {
            uVar32 = uVar26 + ~b_frames;
            if ((int)uVar24 <= (int)(uVar26 + ~b_frames)) {
              uVar32 = uVar24;
            }
          }
          else {
            uVar28 = uVar26 + ~uVar24;
            if ((int)b_frames <= (int)(uVar26 + ~uVar24)) {
              uVar28 = b_frames;
            }
          }
          uVar12 = uVar28;
          uVar11 = uVar32;
          if ((0 < (int)b_frames) && (0 < (int)uVar24)) {
            if ((int)uVar28 < (int)uVar32) {
              dVar35 = 1.0 - dVar35;
              if (dVar35 <= 0.01) {
                dVar35 = 0.01;
              }
              uVar11 = (int)(0.4 / dVar35) + uVar28;
              if ((int)uVar32 < (int)uVar11) {
                uVar11 = uVar32;
              }
            }
            else {
              dVar38 = 1.0 - dVar38;
              if (dVar38 <= 0.01) {
                dVar38 = 0.01;
              }
              uVar12 = (int)(0.4 / dVar38) + uVar32;
              if ((int)uVar28 < (int)uVar12) {
                uVar12 = uVar28;
              }
            }
          }
        }
      }
      uVar24 = uVar12 + uVar11 + 1;
      uVar30 = 0;
      uVar31 = 0;
      if (0 < (int)uVar24) {
        uVar31 = (ulong)uVar24;
      }
      for (; uVar31 != uVar30; uVar30 = uVar30 + 1) {
        plVar17 = av1_lookahead_peek(cpi->ppi->lookahead,
                                     (filter_frame_lookahead_idx - uVar11) + (int)uVar30,
                                     cpi->compressor_stage);
        (cpi->tf_ctx).frames[uVar30] = &plVar17->img;
      }
      (cpi->tf_ctx).num_frames = uVar24;
      (cpi->tf_ctx).filter_frame_idx = uVar11;
      lVar33 = 0;
      av1_setup_src_planes
                (&(cpi->td).mb,&frame->img,0,0,num_planes,((cpi->common).seq_params)->sb_size);
      pSVar6 = (cpi->common).seq_params;
      av1_setup_block_planes
                (&(cpi->td).mb.e_mbd,pSVar6->subsampling_x,pSVar6->subsampling_y,num_planes);
      sf = &(cpi->tf_ctx).sf;
      pYVar7 = (cpi->tf_ctx).frames[0];
      iVar14 = (pYVar7->field_2).field_0.y_crop_width;
      iVar36 = (pYVar7->field_3).field_0.y_crop_height;
      av1_setup_scale_factors_for_frame(sf,iVar14,iVar36,iVar14,iVar36);
      pYVar7 = (cpi->tf_ctx).frames[(cpi->tf_ctx).filter_frame_idx];
      uVar24 = pYVar7->flags;
      lVar29 = 0xa30;
      if (((cpi->common).seq_params)->monochrome == '\0') {
        lVar29 = 0x1e90;
      }
      iVar14 = 0;
      for (; lVar29 != lVar33; lVar33 = lVar33 + 0xa30) {
        iVar14 = iVar14 + (0x400U >>
                          ((char)*(undefined4 *)
                                  ((long)(cpi->td).mb.e_mbd.plane[0].pre + lVar33 + -0x28) +
                           (char)*(undefined4 *)
                                  ((long)(cpi->td).mb.e_mbd.plane[0].pre + lVar33 + -0x2c) & 0x1fU))
        ;
      }
      iVar36 = (pYVar7->field_3).field_0.y_crop_height + 0x1f;
      iVar10 = (pYVar7->field_2).field_0.y_crop_width + 0x1f;
      (cpi->tf_ctx).num_pels = iVar14;
      (cpi->tf_ctx).mb_rows = (int)(((uint)(iVar36 >> 0x1f) >> 0x1b) + iVar36) >> 5;
      (cpi->tf_ctx).mb_cols = (int)(((uint)(iVar10 >> 0x1f) >> 0x1b) + iVar10) >> 5;
      (cpi->tf_ctx).is_highbitdepth = uVar24 >> 3 & 1;
      iVar14 = get_q(cpi);
      (cpi->tf_ctx).q_factor = iVar14;
      iVar14 = (cpi->tf_ctx).is_highbitdepth;
      iVar36 = (cpi->tf_ctx).num_pels;
      size = (size_t)iVar36;
      pMVar18 = (MB_MODE_INFO *)aom_calloc(1,0xb0);
      (cpi->td).tf_data.tmp_mbmi = pMVar18;
      puVar19 = (uint32_t *)aom_memalign(0x10,size * 4);
      (cpi->td).tf_data.accum = puVar19;
      puVar20 = (uint16_t *)aom_memalign(0x10,size * 2);
      (cpi->td).tf_data.count = puVar20;
      if (iVar14 == 0) {
        puVar22 = (uint8_t *)aom_memalign(0x20,size);
      }
      else {
        pvVar21 = aom_memalign(0x20,(long)(iVar36 * 2));
        puVar22 = (uint8_t *)((ulong)pvVar21 >> 1);
      }
      (cpi->td).tf_data.pred = puVar22;
      if ((((cpi->td).tf_data.tmp_mbmi == (MB_MODE_INFO *)0x0) ||
          ((cpi->td).tf_data.accum == (uint32_t *)0x0)) ||
         (((cpi->td).tf_data.count == (uint16_t *)0x0 || (puVar22 == (uint8_t *)0x0)))) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Error allocating temporal filter data");
      }
      else {
        (pTVar1->diff).sum = 0;
        (pTVar1->diff).sse = 0;
      }
      if ((cpi->mt_info).num_workers < 2) {
        lVar29 = (ulong)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
        pbVar23 = (cpi->td).mb.e_mbd.plane[0].pre;
        for (lVar33 = 0; lVar29 != lVar33; lVar33 = lVar33 + 1) {
          input_buffer[lVar33] = pbVar23->buf;
          pbVar23 = (buf_2d *)((long)(pbVar23 + 0x51) + 0x10);
        }
        ppMVar8 = (cpi->td).mb.e_mbd.mi;
        (cpi->td).mb.e_mbd.block_ref_scale_factors[0] = sf;
        (cpi->td).mb.e_mbd.block_ref_scale_factors[1] = sf;
        (cpi->td).mb.e_mbd.mi = &(cpi->td).tf_data.tmp_mbmi;
        ((cpi->td).tf_data.tmp_mbmi)->motion_mode = '\0';
        for (iVar36 = 0; iVar36 < (cpi->tf_ctx).mb_rows; iVar36 = iVar36 + 1) {
          av1_tf_do_filtering_row(cpi,&cpi->td,iVar36);
        }
        pbVar23 = (cpi->td).mb.e_mbd.plane[0].pre;
        for (lVar33 = 0; lVar29 != lVar33; lVar33 = lVar33 + 1) {
          pbVar23->buf = input_buffer[lVar33];
          pbVar23 = (buf_2d *)((long)(pbVar23 + 0x51) + 0x10);
        }
        (cpi->td).mb.e_mbd.mi = ppMVar8;
      }
      else {
        av1_tf_do_filtering_mt(cpi);
      }
      if (frame_diff != (FRAME_DIFF *)0x0) {
        iVar9 = (cpi->td).tf_data.diff.sse;
        frame_diff->sum = (pTVar1->diff).sum;
        frame_diff->sse = iVar9;
      }
      if (iVar14 != 0) {
        ppuVar2 = &(cpi->td).tf_data.pred;
        *ppuVar2 = (uint8_t *)((long)*ppuVar2 << 1);
      }
      aom_free((cpi->td).tf_data.tmp_mbmi);
      (cpi->td).tf_data.tmp_mbmi = (MB_MODE_INFO *)0x0;
      aom_free((cpi->td).tf_data.accum);
      (cpi->td).tf_data.accum = (uint32_t *)0x0;
      aom_free((cpi->td).tf_data.count);
      (cpi->td).tf_data.count = (uint16_t *)0x0;
      aom_free((cpi->td).tf_data.pred);
      (cpi->td).tf_data.pred = (uint8_t *)0x0;
      return;
    }
    if (pFVar27 + -uVar31 <= ((cpi->ppi->twopass).stats_buf_ctx)->stats_in_start) {
      uVar24 = (uint)uVar30;
      goto LAB_0020e869;
    }
    dVar37 = pFVar27[-uVar31].cor_coeff;
    if (dVar37 <= 0.001) {
      dVar37 = 0.001;
    }
    dVar38 = dVar38 * dVar37;
    uVar30 = uVar30 + 1;
    pFVar27 = pFVar27 + -1;
  } while( true );
}

Assistant:

void av1_temporal_filter(AV1_COMP *cpi, const int filter_frame_lookahead_idx,
                         int gf_frame_index, FRAME_DIFF *frame_diff,
                         YV12_BUFFER_CONFIG *output_frame) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  // Basic informaton of the current frame.
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  TemporalFilterData *tf_data = &cpi->td.tf_data;
  const int compute_frame_diff = frame_diff != NULL;
  // TODO(anyone): Currently, we enforce the filtering strength on internal
  // ARFs except the second ARF to be zero. We should investigate in which case
  // it is more beneficial to use non-zero strength filtering.
  // Only parallel level 0 frames go through temporal filtering.
  assert(cpi->ppi->gf_group.frame_parallel_level[gf_frame_index] == 0);

  // Initialize temporal filter context structure.
  init_tf_ctx(cpi, filter_frame_lookahead_idx, gf_frame_index,
              compute_frame_diff, output_frame);

  // Allocate and reset temporal filter buffers.
  const int is_highbitdepth = tf_ctx->is_highbitdepth;
  if (!tf_alloc_and_reset_data(tf_data, tf_ctx->num_pels, is_highbitdepth)) {
    aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }

  // Perform temporal filtering process.
  if (mt_info->num_workers > 1)
    av1_tf_do_filtering_mt(cpi);
  else
    tf_do_filtering(cpi);

  if (compute_frame_diff) {
    *frame_diff = tf_data->diff;
  }
  // Deallocate temporal filter buffers.
  tf_dealloc_data(tf_data, is_highbitdepth);
}